

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O1

CURLcode rtsp_do(connectdata *conn,_Bool *done)

{
  long *plVar1;
  Curl_RtspReq CVar2;
  Curl_easy *data;
  void *pvVar3;
  char *pcVar4;
  CURLcode CVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  Curl_send_buffer *in;
  size_t sVar12;
  curl_off_t *writecountp;
  char *path;
  Curl_HttpReq CVar13;
  char *pcVar14;
  char *pcVar15;
  size_t size;
  char *local_80;
  char *local_70;
  char *local_68;
  
  data = conn->data;
  CVar2 = (data->set).rtspreq;
  pvVar3 = (data->req).protop;
  *done = true;
  *(long *)((long)pvVar3 + 0x88) = (data->state).rtsp_next_client_CSeq;
  *(undefined8 *)((long)pvVar3 + 0x90) = 0;
  (data->set).opt_no_body = true;
  switch(CVar2) {
  case RTSPREQ_OPTIONS:
    pcVar15 = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    (data->set).opt_no_body = false;
    pcVar15 = "DESCRIBE";
    break;
  case RTSPREQ_ANNOUNCE:
    pcVar15 = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    pcVar15 = "SETUP";
    break;
  case RTSPREQ_PLAY:
    pcVar15 = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    pcVar15 = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    pcVar15 = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    (data->set).opt_no_body = false;
    pcVar15 = "GET_PARAMETER";
    break;
  case RTSPREQ_SET_PARAMETER:
    pcVar15 = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    pcVar15 = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    (data->set).opt_no_body = false;
    pcVar15 = "";
    break;
  case RTSPREQ_LAST:
    pcVar15 = "Got invalid RTSP request: RTSPREQ_LAST";
    goto LAB_0013a2ec;
  default:
    pcVar15 = "Got invalid RTSP request";
    goto LAB_0013a2ec;
  }
  if (CVar2 == RTSPREQ_RECEIVE) {
    Curl_setup_transfer(conn,0,-1,true,(curl_off_t *)((long)pvVar3 + 0x28),-1,(curl_off_t *)0x0);
    return CURLE_OK;
  }
  pcVar4 = (data->set).str[0x2f];
  if (CVar2 < RTSPREQ_GET_PARAMETER || pcVar4 != (char *)0x0) {
    pcVar7 = (data->set).str[0x30];
    path = "*";
    if (pcVar7 != (char *)0x0) {
      path = pcVar7;
    }
    pcVar7 = Curl_checkheaders(conn,"Transport:");
    if (pcVar7 == (char *)0x0 && CVar2 == RTSPREQ_SETUP) {
      if ((data->set).str[0x31] == (char *)0x0) {
        pcVar15 = "Refusing to issue an RTSP SETUP without a Transport: header.";
        goto LAB_0013a2ec;
      }
      (*Curl_cfree)((conn->allocptr).rtsp_transport);
      (conn->allocptr).rtsp_transport = (char *)0x0;
      pcVar7 = curl_maprintf("Transport: %s\r\n",(data->set).str[0x31]);
      (conn->allocptr).rtsp_transport = pcVar7;
      if (pcVar7 != (char *)0x0) goto LAB_0013a036;
    }
    else {
LAB_0013a036:
      if (CVar2 == RTSPREQ_DESCRIBE) {
        pcVar8 = Curl_checkheaders(conn,"Accept:");
        local_80 = (char *)0x0;
        local_68 = "Accept: application/sdp\r\n";
        if (pcVar8 != (char *)0x0) {
          local_68 = (char *)0x0;
        }
        pcVar8 = Curl_checkheaders(conn,"Accept-Encoding:");
        if (pcVar8 == (char *)0x0) {
          if ((data->set).str[9] == (char *)0x0) goto LAB_0013a109;
          (*Curl_cfree)((conn->allocptr).accept_encoding);
          (conn->allocptr).accept_encoding = (char *)0x0;
          local_80 = curl_maprintf("Accept-Encoding: %s\r\n",(data->set).str[9]);
          (conn->allocptr).accept_encoding = local_80;
          if (local_80 == (char *)0x0) goto LAB_0013a492;
        }
      }
      else {
        local_68 = (char *)0x0;
LAB_0013a109:
        local_80 = (char *)0x0;
      }
      pcVar8 = Curl_checkheaders(conn,"User-Agent:");
      if ((pcVar8 == (char *)0x0) || (pcVar8 = (conn->allocptr).uagent, pcVar8 == (char *)0x0)) {
        pcVar8 = Curl_checkheaders(conn,"User-Agent:");
        if (pcVar8 != (char *)0x0) goto LAB_0013a165;
        if ((data->set).str[0x24] == (char *)0x0) {
          local_70 = (char *)0x0;
        }
        else {
          local_70 = (conn->allocptr).uagent;
        }
      }
      else {
        (*Curl_cfree)(pcVar8);
        (conn->allocptr).uagent = (char *)0x0;
LAB_0013a165:
        local_70 = (char *)0x0;
      }
      CVar5 = Curl_http_output_auth(conn,pcVar15,path,false);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      pcVar8 = (conn->allocptr).proxyuserpwd;
      pcVar14 = (conn->allocptr).userpwd;
      (*Curl_cfree)((conn->allocptr).ref);
      (conn->allocptr).ref = (char *)0x0;
      if (((data->change).referer == (char *)0x0) ||
         (pcVar9 = Curl_checkheaders(conn,"Referer:"), pcVar9 != (char *)0x0)) {
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar9 = curl_maprintf("Referer: %s\r\n",(data->change).referer);
      }
      (conn->allocptr).ref = pcVar9;
      pcVar10 = (char *)0x0;
      if (((CVar2 & (RTSPREQ_LAST|RTSPREQ_ANNOUNCE)) != RTSPREQ_NONE) &&
         ((data->state).use_range != false)) {
        pcVar10 = Curl_checkheaders(conn,"Range:");
        if ((pcVar10 == (char *)0x0) && ((data->state).range != (char *)0x0)) {
          (*Curl_cfree)((conn->allocptr).rangeline);
          (conn->allocptr).rangeline = (char *)0x0;
          pcVar10 = curl_maprintf("Range: %s\r\n",(data->state).range);
          (conn->allocptr).rangeline = pcVar10;
        }
        else {
          pcVar10 = (char *)0x0;
        }
      }
      pcVar11 = Curl_checkheaders(conn,"CSeq:");
      if (pcVar11 != (char *)0x0) {
        Curl_failf(data,"CSeq cannot be set as a custom header.");
        return CURLE_RTSP_CSEQ_ERROR;
      }
      pcVar11 = Curl_checkheaders(conn,"Session:");
      if (pcVar11 != (char *)0x0) {
        pcVar15 = "Session ID cannot be set as a custom header.";
LAB_0013a2ec:
        Curl_failf(data,pcVar15);
        goto LAB_0013a2f6;
      }
      in = Curl_add_buffer_init();
      if (in != (Curl_send_buffer *)0x0) {
        CVar5 = Curl_add_bufferf(in,"%s %s RTSP/1.0\r\nCSeq: %ld\r\n",pcVar15,path,
                                 *(undefined8 *)((long)pvVar3 + 0x88));
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
        if ((pcVar4 != (char *)0x0) &&
           (CVar5 = Curl_add_bufferf(in,"Session: %s\r\n"), CVar5 != CURLE_OK)) {
          return CVar5;
        }
        if (pcVar7 == (char *)0x0) {
          pcVar7 = "";
        }
        if (local_68 == (char *)0x0) {
          local_68 = "";
        }
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        if (pcVar10 == (char *)0x0) {
          pcVar10 = "";
        }
        if (pcVar9 == (char *)0x0) {
          pcVar9 = "";
        }
        if (local_70 == (char *)0x0) {
          local_70 = "";
        }
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "";
        }
        if (pcVar14 == (char *)0x0) {
          pcVar14 = "";
        }
        CVar5 = Curl_add_bufferf(in,"%s%s%s%s%s%s%s%s",pcVar7,local_68,local_80,pcVar10,pcVar9,
                                 local_70,pcVar8,pcVar14);
        (*Curl_cfree)((conn->allocptr).userpwd);
        (conn->allocptr).userpwd = (char *)0x0;
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
        if (((CVar2 == RTSPREQ_SETUP) || (CVar2 == RTSPREQ_DESCRIBE)) &&
           (CVar5 = Curl_add_timecondition(data,in), CVar5 != CURLE_OK)) {
          return CVar5;
        }
        CVar5 = Curl_add_custom_headers(conn,false,in);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
        size = 0;
        if (CVar2 < RTSPREQ_RECORD) {
          local_80 = (char *)0x0;
          if ((0x308U >> (CVar2 & 0x1f) & 1) != 0) {
            sVar12 = (data->state).infilesize;
            if ((data->set).upload == false) {
              CVar13 = HTTPREQ_POST;
              if (sVar12 == 0xffffffffffffffff) {
                pcVar15 = (char *)(data->set).postfields;
                if (pcVar15 == (char *)0x0) {
                  sVar12 = 0;
                }
                else {
                  sVar12 = strlen(pcVar15);
                }
              }
              local_80 = (char *)0x0;
              size = sVar12;
            }
            else {
              CVar13 = HTTPREQ_PUT;
              size = 0;
              local_80 = (char *)sVar12;
            }
            (data->set).httpreq = CVar13;
            if ((long)size < 1 && (long)local_80 < 1) {
              if (CVar2 == RTSPREQ_GET_PARAMETER) {
                (data->set).httpreq = HTTPREQ_HEAD;
                (data->set).opt_no_body = true;
              }
            }
            else {
              pcVar15 = Curl_checkheaders(conn,"Content-Length:");
              if (pcVar15 == (char *)0x0) {
                pcVar15 = (char *)size;
                if ((data->set).upload != false) {
                  pcVar15 = local_80;
                }
                CVar5 = Curl_add_bufferf(in,"Content-Length: %lld\r\n",pcVar15);
                if (CVar5 != CURLE_OK) {
                  return CVar5;
                }
              }
              if ((((CVar2 & RTSPREQ_RECORD) == RTSPREQ_GET_PARAMETER) &&
                  (pcVar15 = Curl_checkheaders(conn,"Content-Type:"), pcVar15 == (char *)0x0)) &&
                 (CVar5 = Curl_add_bufferf(in,"Content-Type: text/parameters\r\n"),
                 CVar5 != CURLE_OK)) {
                return CVar5;
              }
              if (((CVar2 == RTSPREQ_ANNOUNCE) &&
                  (pcVar15 = Curl_checkheaders(conn,"Content-Type:"), pcVar15 == (char *)0x0)) &&
                 (CVar5 = Curl_add_bufferf(in,"Content-Type: application/sdp\r\n"),
                 CVar5 != CURLE_OK)) {
                return CVar5;
              }
              (data->state).expect100header = false;
            }
          }
        }
        else {
          local_80 = (char *)0x0;
        }
        (data->req).forbidchunk = true;
        CVar5 = Curl_add_buffer(in,"\r\n",2);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
        if ((0 < (long)size) &&
           (CVar5 = Curl_add_buffer(in,(data->set).postfields,size), CVar5 != CURLE_OK)) {
          return CVar5;
        }
        CVar5 = Curl_add_buffer_send(in,conn,&(data->info).request_size,0,0);
        if (CVar5 != CURLE_OK) {
          Curl_failf(data,"Failed sending RTSP request");
          return CVar5;
        }
        writecountp = (curl_off_t *)((long)pvVar3 + 0x30);
        if (local_80 == (char *)0x0) {
          writecountp = (curl_off_t *)0x0;
        }
        Curl_setup_transfer(conn,0,-1,true,(curl_off_t *)((long)pvVar3 + 0x28),
                            -(uint)(local_80 == (char *)0x0),writecountp);
        plVar1 = &(data->state).rtsp_next_client_CSeq;
        *plVar1 = *plVar1 + 1;
        if (*(long *)((long)pvVar3 + 0x30) == 0) {
          return CURLE_OK;
        }
        Curl_pgrsSetUploadCounter(data,*(long *)((long)pvVar3 + 0x30));
        iVar6 = Curl_pgrsUpdate(conn);
        if (iVar6 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
        return CURLE_OK;
      }
    }
LAB_0013a492:
    CVar5 = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_failf(data,"Refusing to issue an RTSP request [%s] without a session ID.",pcVar15);
LAB_0013a2f6:
    CVar5 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  return CVar5;
}

Assistant:

static CURLcode rtsp_do(struct connectdata *conn, bool *done)
{
  struct Curl_easy *data = conn->data;
  CURLcode result=CURLE_OK;
  Curl_RtspReq rtspreq = data->set.rtspreq;
  struct RTSP *rtsp = data->req.protop;
  struct HTTP *http;
  Curl_send_buffer *req_buffer;
  curl_off_t postsize = 0; /* for ANNOUNCE and SET_PARAMETER */
  curl_off_t putsize = 0; /* for ANNOUNCE and SET_PARAMETER */

  const char *p_request = NULL;
  const char *p_session_id = NULL;
  const char *p_accept = NULL;
  const char *p_accept_encoding = NULL;
  const char *p_range = NULL;
  const char *p_referrer = NULL;
  const char *p_stream_uri = NULL;
  const char *p_transport = NULL;
  const char *p_uagent = NULL;
  const char *p_proxyuserpwd = NULL;
  const char *p_userpwd = NULL;

  *done = TRUE;

  http = &(rtsp->http_wrapper);
  /* Assert that no one has changed the RTSP struct in an evil way */
  DEBUGASSERT((void *)http == (void *)rtsp);

  rtsp->CSeq_sent = data->state.rtsp_next_client_CSeq;
  rtsp->CSeq_recv = 0;

  /* Setup the 'p_request' pointer to the proper p_request string
   * Since all RTSP requests are included here, there is no need to
   * support custom requests like HTTP.
   **/
  data->set.opt_no_body = TRUE; /* most requests don't contain a body */
  switch(rtspreq) {
  default:
    failf(data, "Got invalid RTSP request");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  case RTSPREQ_OPTIONS:
    p_request = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    p_request = "DESCRIBE";
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_ANNOUNCE:
    p_request = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    p_request = "SETUP";
    break;
  case RTSPREQ_PLAY:
    p_request = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    p_request = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    p_request = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    /* GET_PARAMETER's no_body status is determined later */
    p_request = "GET_PARAMETER";
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_SET_PARAMETER:
    p_request = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    p_request = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    p_request = "";
    /* Treat interleaved RTP as body*/
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_LAST:
    failf(data, "Got invalid RTSP request: RTSPREQ_LAST");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  if(rtspreq == RTSPREQ_RECEIVE) {
    Curl_setup_transfer(conn, FIRSTSOCKET, -1, TRUE,
                        &http->readbytecount, -1, NULL);

    return result;
  }

  p_session_id = data->set.str[STRING_RTSP_SESSION_ID];
  if(!p_session_id &&
     (rtspreq & ~(RTSPREQ_OPTIONS | RTSPREQ_DESCRIBE | RTSPREQ_SETUP))) {
    failf(data, "Refusing to issue an RTSP request [%s] without a session ID.",
          p_request);
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  /* TODO: proxy? */

  /* Stream URI. Default to server '*' if not specified */
  if(data->set.str[STRING_RTSP_STREAM_URI]) {
    p_stream_uri = data->set.str[STRING_RTSP_STREAM_URI];
  }
  else {
    p_stream_uri = "*";
  }

  /* Transport Header for SETUP requests */
  p_transport = Curl_checkheaders(conn, "Transport:");
  if(rtspreq == RTSPREQ_SETUP && !p_transport) {
    /* New Transport: setting? */
    if(data->set.str[STRING_RTSP_TRANSPORT]) {
      Curl_safefree(conn->allocptr.rtsp_transport);

      conn->allocptr.rtsp_transport =
        aprintf("Transport: %s\r\n",
                data->set.str[STRING_RTSP_TRANSPORT]);
      if(!conn->allocptr.rtsp_transport)
        return CURLE_OUT_OF_MEMORY;
    }
    else {
      failf(data,
            "Refusing to issue an RTSP SETUP without a Transport: header.");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }

    p_transport = conn->allocptr.rtsp_transport;
  }

  /* Accept Headers for DESCRIBE requests */
  if(rtspreq == RTSPREQ_DESCRIBE) {
    /* Accept Header */
    p_accept = Curl_checkheaders(conn, "Accept:")?
      NULL:"Accept: application/sdp\r\n";

    /* Accept-Encoding header */
    if(!Curl_checkheaders(conn, "Accept-Encoding:") &&
       data->set.str[STRING_ENCODING]) {
      Curl_safefree(conn->allocptr.accept_encoding);
      conn->allocptr.accept_encoding =
        aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);

      if(!conn->allocptr.accept_encoding)
        return CURLE_OUT_OF_MEMORY;

      p_accept_encoding = conn->allocptr.accept_encoding;
    }
  }

  /* The User-Agent string might have been allocated in url.c already, because
     it might have been used in the proxy connect, but if we have got a header
     with the user-agent string specified, we erase the previously made string
     here. */
  if(Curl_checkheaders(conn, "User-Agent:") && conn->allocptr.uagent) {
    Curl_safefree(conn->allocptr.uagent);
    conn->allocptr.uagent = NULL;
  }
  else if(!Curl_checkheaders(conn, "User-Agent:") &&
          data->set.str[STRING_USERAGENT]) {
    p_uagent = conn->allocptr.uagent;
  }

  /* setup the authentication headers */
  result = Curl_http_output_auth(conn, p_request, p_stream_uri, FALSE);
  if(result)
    return result;

  p_proxyuserpwd = conn->allocptr.proxyuserpwd;
  p_userpwd = conn->allocptr.userpwd;

  /* Referrer */
  Curl_safefree(conn->allocptr.ref);
  if(data->change.referer && !Curl_checkheaders(conn, "Referer:"))
    conn->allocptr.ref = aprintf("Referer: %s\r\n", data->change.referer);
  else
    conn->allocptr.ref = NULL;

  p_referrer = conn->allocptr.ref;

  /*
   * Range Header
   * Only applies to PLAY, PAUSE, RECORD
   *
   * Go ahead and use the Range stuff supplied for HTTP
   */
  if(data->state.use_range &&
     (rtspreq  & (RTSPREQ_PLAY | RTSPREQ_PAUSE | RTSPREQ_RECORD))) {

    /* Check to see if there is a range set in the custom headers */
    if(!Curl_checkheaders(conn, "Range:") && data->state.range) {
      Curl_safefree(conn->allocptr.rangeline);
      conn->allocptr.rangeline = aprintf("Range: %s\r\n", data->state.range);
      p_range = conn->allocptr.rangeline;
    }
  }

  /*
   * Sanity check the custom headers
   */
  if(Curl_checkheaders(conn, "CSeq:")) {
    failf(data, "CSeq cannot be set as a custom header.");
    return CURLE_RTSP_CSEQ_ERROR;
  }
  if(Curl_checkheaders(conn, "Session:")) {
    failf(data, "Session ID cannot be set as a custom header.");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  /* Initialize a dynamic send buffer */
  req_buffer = Curl_add_buffer_init();

  if(!req_buffer)
    return CURLE_OUT_OF_MEMORY;

  result =
    Curl_add_bufferf(req_buffer,
                     "%s %s RTSP/1.0\r\n" /* Request Stream-URI RTSP/1.0 */
                     "CSeq: %ld\r\n", /* CSeq */
                     p_request, p_stream_uri, rtsp->CSeq_sent);
  if(result)
    return result;

  /*
   * Rather than do a normal alloc line, keep the session_id unformatted
   * to make comparison easier
   */
  if(p_session_id) {
    result = Curl_add_bufferf(req_buffer, "Session: %s\r\n", p_session_id);
    if(result)
      return result;
  }

  /*
   * Shared HTTP-like options
   */
  result = Curl_add_bufferf(req_buffer,
                            "%s" /* transport */
                            "%s" /* accept */
                            "%s" /* accept-encoding */
                            "%s" /* range */
                            "%s" /* referrer */
                            "%s" /* user-agent */
                            "%s" /* proxyuserpwd */
                            "%s" /* userpwd */
                            ,
                            p_transport ? p_transport : "",
                            p_accept ? p_accept : "",
                            p_accept_encoding ? p_accept_encoding : "",
                            p_range ? p_range : "",
                            p_referrer ? p_referrer : "",
                            p_uagent ? p_uagent : "",
                            p_proxyuserpwd ? p_proxyuserpwd : "",
                            p_userpwd ? p_userpwd : "");

  /*
   * Free userpwd now --- cannot reuse this for Negotiate and possibly NTLM
   * with basic and digest, it will be freed anyway by the next request
   */
  Curl_safefree(conn->allocptr.userpwd);
  conn->allocptr.userpwd = NULL;

  if(result)
    return result;

  if((rtspreq == RTSPREQ_SETUP) || (rtspreq == RTSPREQ_DESCRIBE)) {
    result = Curl_add_timecondition(data, req_buffer);
    if(result)
      return result;
  }

  result = Curl_add_custom_headers(conn, FALSE, req_buffer);
  if(result)
    return result;

  if(rtspreq == RTSPREQ_ANNOUNCE ||
     rtspreq == RTSPREQ_SET_PARAMETER ||
     rtspreq == RTSPREQ_GET_PARAMETER) {

    if(data->set.upload) {
      putsize = data->state.infilesize;
      data->set.httpreq = HTTPREQ_PUT;

    }
    else {
      postsize = (data->state.infilesize != -1)?
        data->state.infilesize:
        (data->set.postfields? (curl_off_t)strlen(data->set.postfields):0);
      data->set.httpreq = HTTPREQ_POST;
    }

    if(putsize > 0 || postsize > 0) {
      /* As stated in the http comments, it is probably not wise to
       * actually set a custom Content-Length in the headers */
      if(!Curl_checkheaders(conn, "Content-Length:")) {
        result = Curl_add_bufferf(req_buffer,
            "Content-Length: %" CURL_FORMAT_CURL_OFF_T"\r\n",
            (data->set.upload ? putsize : postsize));
        if(result)
          return result;
      }

      if(rtspreq == RTSPREQ_SET_PARAMETER ||
         rtspreq == RTSPREQ_GET_PARAMETER) {
        if(!Curl_checkheaders(conn, "Content-Type:")) {
          result = Curl_add_bufferf(req_buffer,
              "Content-Type: text/parameters\r\n");
          if(result)
            return result;
        }
      }

      if(rtspreq == RTSPREQ_ANNOUNCE) {
        if(!Curl_checkheaders(conn, "Content-Type:")) {
          result = Curl_add_bufferf(req_buffer,
              "Content-Type: application/sdp\r\n");
          if(result)
            return result;
        }
      }

      data->state.expect100header = FALSE; /* RTSP posts are simple/small */
    }
    else if(rtspreq == RTSPREQ_GET_PARAMETER) {
      /* Check for an empty GET_PARAMETER (heartbeat) request */
      data->set.httpreq = HTTPREQ_HEAD;
      data->set.opt_no_body = TRUE;
    }
  }

  /* RTSP never allows chunked transfer */
  data->req.forbidchunk = TRUE;
  /* Finish the request buffer */
  result = Curl_add_buffer(req_buffer, "\r\n", 2);
  if(result)
    return result;

  if(postsize > 0) {
    result = Curl_add_buffer(req_buffer, data->set.postfields,
                             (size_t)postsize);
    if(result)
      return result;
  }

  /* issue the request */
  result = Curl_add_buffer_send(req_buffer, conn,
                                &data->info.request_size, 0, FIRSTSOCKET);
  if(result) {
    failf(data, "Failed sending RTSP request");
    return result;
  }

  Curl_setup_transfer(conn, FIRSTSOCKET, -1, TRUE, &http->readbytecount,
                      putsize?FIRSTSOCKET:-1,
                      putsize?&http->writebytecount:NULL);

  /* Increment the CSeq on success */
  data->state.rtsp_next_client_CSeq++;

  if(http->writebytecount) {
    /* if a request-body has been sent off, we make sure this progress is
       noted properly */
    Curl_pgrsSetUploadCounter(data, http->writebytecount);
    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
  }

  return result;
}